

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_io.c
# Opt level: O0

int arkSetMaxStep(void *arkode_mem,realtype hmax)

{
  ARKodeMem in_RDI;
  double in_XMM0_Qa;
  ARKodeMem ark_mem;
  realtype hmax_inv;
  int local_4;
  
  if (in_RDI == (ARKodeMem)0x0) {
    arkProcessError((ARKodeMem)0x0,-0x15,"ARKode","arkSetMaxStep","arkode_mem = NULL illegal.");
    local_4 = -0x15;
  }
  else if (0.0 < in_XMM0_Qa) {
    if ((1.0 / in_XMM0_Qa) * in_RDI->hmin <= 1.0) {
      in_RDI->hmax_inv = 1.0 / in_XMM0_Qa;
      local_4 = 0;
    }
    else {
      arkProcessError(in_RDI,-0x16,"ARKode","arkSetMaxStep",
                      "Inconsistent step size limits: hmin > hmax.");
      local_4 = -0x16;
    }
  }
  else {
    in_RDI->hmax_inv = 0.0;
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int arkSetMaxStep(void *arkode_mem, realtype hmax)
{
  realtype hmax_inv;
  ARKodeMem ark_mem;
  if (arkode_mem==NULL) {
    arkProcessError(NULL, ARK_MEM_NULL, "ARKode",
                    "arkSetMaxStep", MSG_ARK_NO_MEM);
    return (ARK_MEM_NULL);
  }
  ark_mem = (ARKodeMem) arkode_mem;

  /* Passing a value <= 0 sets hmax = infinity */
  if (hmax <= ZERO) {
    ark_mem->hmax_inv = ZERO;
    return(ARK_SUCCESS);
  }

  /* check that hmax and hmin are agreeable */
  hmax_inv = ONE/hmax;
  if (hmax_inv * ark_mem->hmin > ONE) {
    arkProcessError(ark_mem, ARK_ILL_INPUT, "ARKode",
                    "arkSetMaxStep", MSG_ARK_BAD_HMIN_HMAX);
    return(ARK_ILL_INPUT);
  }

  /* set the value */
  ark_mem->hmax_inv = hmax_inv;

  return(ARK_SUCCESS);
}